

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

void __thiscall
glslang::TIntermediate::mergeModes(TIntermediate *this,TInfoSink *infoSink,TIntermediate *unit)

{
  EShLanguage EVar1;
  TLayoutGeometry TVar2;
  pointer pTVar3;
  uint uVar4;
  int iVar5;
  pointer pTVar6;
  _Rb_tree_node_base *p_Var7;
  int iVar8;
  char *message;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint i;
  
  if (this->language != unit->language) {
    error(this,infoSink,"stages must match when linking into a single stage",EShLangCount);
  }
  if (this->source == EShSourceNone) {
    this->source = unit->source;
  }
  if (this->source != unit->source) {
    error(this,infoSink,"can\'t link compilation units from different source languages",EShLangCount
         );
  }
  if (this->treeRoot == (TIntermNode *)0x0) {
    this->profile = unit->profile;
    this->version = unit->version;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(this->requestedExtensions)._M_t,&(unit->requestedExtensions)._M_t);
  }
  else {
    if ((this->profile == EEsProfile) == (unit->profile == EEsProfile)) {
      if (unit->profile == ECompatibilityProfile) {
        this->profile = ECompatibilityProfile;
      }
    }
    else {
      error(this,infoSink,"Cannot cross link ES and desktop profiles",EShLangCount);
    }
    iVar8 = unit->version;
    if (unit->version < this->version) {
      iVar8 = this->version;
    }
    this->version = iVar8;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->requestedExtensions,
               (unit->requestedExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&(unit->requestedExtensions)._M_t._M_impl.super__Rb_tree_header);
  }
  uVar4 = (unit->spvVersion).spv;
  uVar10 = (this->spvVersion).spv;
  iVar8 = (this->spvVersion).vulkanGlsl;
  if (uVar4 < uVar10) {
    uVar4 = uVar10;
  }
  (this->spvVersion).spv = uVar4;
  iVar5 = (unit->spvVersion).vulkanGlsl;
  if (iVar5 < iVar8) {
    iVar5 = iVar8;
  }
  (this->spvVersion).vulkanGlsl = iVar5;
  iVar8 = (this->spvVersion).vulkan;
  iVar5 = (unit->spvVersion).vulkan;
  if (iVar5 < iVar8) {
    iVar5 = iVar8;
  }
  (this->spvVersion).vulkan = iVar5;
  iVar8 = (this->spvVersion).openGl;
  iVar5 = (unit->spvVersion).openGl;
  if (iVar5 < iVar8) {
    iVar5 = iVar8;
  }
  (this->spvVersion).openGl = iVar5;
  if ((unit->spvVersion).vulkanRelaxed == true) {
    (this->spvVersion).vulkanRelaxed = true;
  }
  this->numErrors = this->numErrors + unit->numErrors;
  if ((1 < this->numPushConstants) || (1 < unit->numPushConstants)) {
    error(this,infoSink,"Only one push_constant block is allowed per stage",EShLangCount);
  }
  iVar5 = unit->numPushConstants + this->numPushConstants;
  iVar8 = 1;
  if (iVar5 < 1) {
    iVar8 = iVar5;
  }
  this->numPushConstants = iVar8;
  iVar8 = unit->invocations;
  if (iVar8 != -1) {
    if (this->invocations == -1) {
      this->invocations = iVar8;
    }
    else if (this->invocations != iVar8) {
      error(this,infoSink,"number of invocations must match between compilation units",EShLangCount)
      ;
    }
  }
  iVar8 = unit->vertices;
  if (this->vertices == -1) {
    this->vertices = iVar8;
  }
  else if (this->vertices != iVar8 && iVar8 != -1) {
    EVar1 = this->language;
    if (EVar1 == EShLangTessControl) {
      message = "Contradictory layout vertices values";
    }
    else {
      if ((EVar1 != EShLangMesh) && (EVar1 != EShLangGeometry)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                      ,0x157,"void glslang::TIntermediate::mergeModes(TInfoSink &, TIntermediate &)"
                     );
      }
      message = "Contradictory layout max_vertices values";
    }
    error(this,infoSink,message,EShLangCount);
  }
  if (this->primitives == -1) {
    this->primitives = unit->primitives;
  }
  else if (this->primitives != unit->primitives) {
    if (this->language != EShLangMesh) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                    ,0x15f,"void glslang::TIntermediate::mergeModes(TInfoSink &, TIntermediate &)");
    }
    error(this,infoSink,"Contradictory layout max_primitives values",EShLangCount);
  }
  TVar2 = unit->inputPrimitive;
  if (this->inputPrimitive == ElgNone) {
    this->inputPrimitive = TVar2;
  }
  else if (this->inputPrimitive != TVar2 && TVar2 != ElgNone) {
    error(this,infoSink,"Contradictory input layout primitives",EShLangCount);
  }
  TVar2 = unit->outputPrimitive;
  if (this->outputPrimitive == ElgNone) {
    this->outputPrimitive = TVar2;
  }
  else if (this->outputPrimitive != TVar2 && TVar2 != ElgNone) {
    error(this,infoSink,"Contradictory output layout primitives",EShLangCount);
  }
  if ((this->originUpperLeft != unit->originUpperLeft) ||
     (this->pixelCenterInteger != unit->pixelCenterInteger)) {
    error(this,infoSink,"gl_FragCoord redeclarations must match across shaders",EShLangCount);
  }
  if (this->vertexSpacing == EvsNone) {
    this->vertexSpacing = unit->vertexSpacing;
  }
  else if (this->vertexSpacing != unit->vertexSpacing) {
    error(this,infoSink,"Contradictory input vertex spacing",EShLangCount);
  }
  if (this->vertexOrder == EvoNone) {
    this->vertexOrder = unit->vertexOrder;
  }
  else if (this->vertexOrder != unit->vertexOrder) {
    error(this,infoSink,"Contradictory triangle ordering",EShLangCount);
  }
  if (unit->pointMode == true) {
    this->pointMode = true;
  }
  lVar9 = 0x284;
  do {
    if (*(char *)((long)&unit->language + lVar9) == '\x01') {
      if (*(char *)((long)&this->language + lVar9) == '\0') {
        *(undefined4 *)((long)this + lVar9 * 4 + -0x798) =
             *(undefined4 *)((long)unit + lVar9 * 4 + -0x798);
        *(undefined1 *)((long)&this->language + lVar9) = 1;
      }
      else if (*(int *)((long)this + lVar9 * 4 + -0x798) !=
               *(int *)((long)unit + lVar9 * 4 + -0x798)) {
        error(this,infoSink,"Contradictory local size",EShLangCount);
      }
    }
    iVar8 = *(int *)((long)this + lVar9 * 4 + -0x788);
    if (iVar8 == -1) {
      *(undefined4 *)((long)this + lVar9 * 4 + -0x788) =
           *(undefined4 *)((long)unit + lVar9 * 4 + -0x788);
    }
    else if (iVar8 != *(int *)((long)unit + lVar9 * 4 + -0x788)) {
      error(this,infoSink,"Contradictory local size specialization ids",EShLangCount);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x287);
  if (unit->earlyFragmentTests != false) {
    this->earlyFragmentTests = true;
  }
  if (unit->postDepthCoverage == true) {
    this->postDepthCoverage = true;
  }
  if (unit->nonCoherentColorAttachmentReadEXT == true) {
    this->nonCoherentColorAttachmentReadEXT = true;
  }
  if (unit->nonCoherentDepthAttachmentReadEXT == true) {
    this->nonCoherentDepthAttachmentReadEXT = true;
  }
  if (unit->nonCoherentStencilAttachmentReadEXT == true) {
    this->nonCoherentStencilAttachmentReadEXT = true;
  }
  if (this->depthLayout == EldNone) {
    this->depthLayout = unit->depthLayout;
  }
  else if (this->depthLayout != unit->depthLayout) {
    error(this,infoSink,"Contradictory depth layouts",EShLangCount);
  }
  if (unit->depthReplacing == true) {
    this->depthReplacing = true;
  }
  if (unit->hlslFunctionality1 == true) {
    this->hlslFunctionality1 = true;
  }
  this->blendEquations = this->blendEquations | unit->blendEquations;
  if (unit->xfbMode == true) {
    this->xfbMode = true;
  }
  pTVar6 = (this->xfbBuffers).
           super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->xfbBuffers).
      super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar6) {
    lVar9 = 0;
    uVar11 = 0;
    do {
      iVar8 = *(int *)((long)&pTVar6->stride + lVar9);
      if (iVar8 == 0x3fff) {
        *(undefined4 *)((long)&pTVar6->stride + lVar9) =
             *(undefined4 *)
              ((long)&((unit->xfbBuffers).
                       super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                       ._M_impl.super__Vector_impl_data._M_start)->stride + lVar9);
      }
      else if (iVar8 != *(int *)((long)&((unit->xfbBuffers).
                                         super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->stride + lVar9)
              ) {
        error(this,infoSink,"Contradictory xfb_stride",EShLangCount);
      }
      pTVar6 = (this->xfbBuffers).
               super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pTVar3 = (unit->xfbBuffers).
               super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl
               .super__Vector_impl_data._M_start;
      uVar4 = *(uint *)((long)&pTVar6->implicitStride + lVar9);
      uVar10 = *(uint *)((long)&pTVar3->implicitStride + lVar9);
      if (uVar10 < uVar4) {
        uVar10 = uVar4;
      }
      *(uint *)((long)&pTVar6->implicitStride + lVar9) = uVar10;
      if ((&pTVar3->contains64BitType)[lVar9] == true) {
        (&pTVar6->contains64BitType)[lVar9] = true;
      }
      if ((&pTVar3->contains32BitType)[lVar9] == true) {
        (&pTVar6->contains32BitType)[lVar9] = true;
      }
      if ((&pTVar3->contains16BitType)[lVar9] == true) {
        (&pTVar6->contains16BitType)[lVar9] = true;
      }
      uVar11 = uVar11 + 1;
      pTVar6 = (this->xfbBuffers).
               super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl
               .super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x28;
    } while (uVar11 < (ulong)(((long)(this->xfbBuffers).
                                     super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar6 >> 3)
                             * -0x3333333333333333));
  }
  if (unit->multiStream != false) {
    this->multiStream = true;
  }
  if (unit->layoutOverrideCoverage == true) {
    this->layoutOverrideCoverage = true;
  }
  if (unit->geoPassthroughEXT == true) {
    this->geoPassthroughEXT = true;
  }
  lVar9 = 0;
  do {
    uVar4 = (unit->shiftBinding)._M_elems[lVar9];
    if (uVar4 != 0) {
      setShiftBinding(this,(TResourceType)lVar9,uVar4);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  lVar9 = 0;
  do {
    for (p_Var7 = (unit->shiftBindingForSet)._M_elems[lVar9]._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var7 !=
        &(unit->shiftBindingForSet)._M_elems[lVar9]._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      setShiftBindingForSet
                (this,(TResourceType)lVar9,*(uint *)&p_Var7[1].field_0x4,p_Var7[1]._M_color);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->resourceSetBinding,
             (this->resourceSetBinding).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (unit->resourceSetBinding).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (unit->resourceSetBinding).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (unit->autoMapBindings != false) {
    this->autoMapBindings = true;
  }
  if (unit->autoMapLocations == true) {
    this->autoMapLocations = true;
  }
  if (unit->invertY == true) {
    this->invertY = true;
  }
  if (unit->dxPositionW == true) {
    this->dxPositionW = true;
  }
  if (unit->debugInfo == true) {
    this->debugInfo = true;
  }
  if (unit->flattenUniformArrays == true) {
    this->flattenUniformArrays = true;
  }
  if (unit->useUnknownFormat == true) {
    this->useUnknownFormat = true;
  }
  if (unit->hlslOffsets == true) {
    this->hlslOffsets = true;
  }
  if (unit->useStorageBuffer == true) {
    this->useStorageBuffer = true;
  }
  if (unit->invariantAll == true) {
    this->invariantAll = true;
  }
  if (unit->hlslIoMapping == true) {
    this->hlslIoMapping = true;
  }
  if (unit->needToLegalize == true) {
    this->needToLegalize = true;
  }
  if (unit->binaryDoubleOutput == true) {
    this->binaryDoubleOutput = true;
  }
  if (unit->usePhysicalStorageBuffer == true) {
    this->usePhysicalStorageBuffer = true;
  }
  return;
}

Assistant:

void TIntermediate::mergeModes(TInfoSink& infoSink, TIntermediate& unit)
{
    if (language != unit.language)
        error(infoSink, "stages must match when linking into a single stage");

    if (getSource() == EShSourceNone)
        setSource(unit.getSource());
    if (getSource() != unit.getSource())
        error(infoSink, "can't link compilation units from different source languages");

    if (treeRoot == nullptr) {
        profile = unit.profile;
        version = unit.version;
        requestedExtensions = unit.requestedExtensions;
    } else {
        if ((isEsProfile()) != (unit.isEsProfile()))
            error(infoSink, "Cannot cross link ES and desktop profiles");
        else if (unit.profile == ECompatibilityProfile)
            profile = ECompatibilityProfile;
        version = std::max(version, unit.version);
        requestedExtensions.insert(unit.requestedExtensions.begin(), unit.requestedExtensions.end());
    }

    MERGE_MAX(spvVersion.spv);
    MERGE_MAX(spvVersion.vulkanGlsl);
    MERGE_MAX(spvVersion.vulkan);
    MERGE_MAX(spvVersion.openGl);
    MERGE_TRUE(spvVersion.vulkanRelaxed);

    numErrors += unit.getNumErrors();
    // Only one push_constant is allowed, mergeLinkerObjects() will ensure the push_constant
    // is the same for all units.
    if (numPushConstants > 1 || unit.numPushConstants > 1)
        error(infoSink, "Only one push_constant block is allowed per stage");
    numPushConstants = std::min(numPushConstants + unit.numPushConstants, 1);

    if (unit.invocations != TQualifier::layoutNotSet) {
        if (invocations == TQualifier::layoutNotSet)
            invocations = unit.invocations;
        else if (invocations != unit.invocations)
            error(infoSink, "number of invocations must match between compilation units");
    }

    if (vertices == TQualifier::layoutNotSet)
        vertices = unit.vertices;
    else if (unit.vertices != TQualifier::layoutNotSet && vertices != unit.vertices) {
        if (language == EShLangGeometry || language == EShLangMesh)
            error(infoSink, "Contradictory layout max_vertices values");
        else if (language == EShLangTessControl)
            error(infoSink, "Contradictory layout vertices values");
        else
            assert(0);
    }
    if (primitives == TQualifier::layoutNotSet)
        primitives = unit.primitives;
    else if (primitives != unit.primitives) {
        if (language == EShLangMesh)
            error(infoSink, "Contradictory layout max_primitives values");
        else
            assert(0);
    }

    if (inputPrimitive == ElgNone)
        inputPrimitive = unit.inputPrimitive;
    else if (unit.inputPrimitive != ElgNone && inputPrimitive != unit.inputPrimitive)
        error(infoSink, "Contradictory input layout primitives");

    if (outputPrimitive == ElgNone)
        outputPrimitive = unit.outputPrimitive;
    else if (unit.outputPrimitive != ElgNone && outputPrimitive != unit.outputPrimitive)
        error(infoSink, "Contradictory output layout primitives");

    if (originUpperLeft != unit.originUpperLeft || pixelCenterInteger != unit.pixelCenterInteger)
        error(infoSink, "gl_FragCoord redeclarations must match across shaders");

    if (vertexSpacing == EvsNone)
        vertexSpacing = unit.vertexSpacing;
    else if (vertexSpacing != unit.vertexSpacing)
        error(infoSink, "Contradictory input vertex spacing");

    if (vertexOrder == EvoNone)
        vertexOrder = unit.vertexOrder;
    else if (vertexOrder != unit.vertexOrder)
        error(infoSink, "Contradictory triangle ordering");

    MERGE_TRUE(pointMode);

    for (int i = 0; i < 3; ++i) {
        if (unit.localSizeNotDefault[i]) {
            if (!localSizeNotDefault[i]) {
                localSize[i] = unit.localSize[i];
                localSizeNotDefault[i] = true;
            }
            else if (localSize[i] != unit.localSize[i])
                error(infoSink, "Contradictory local size");
        }

        if (localSizeSpecId[i] == TQualifier::layoutNotSet)
            localSizeSpecId[i] = unit.localSizeSpecId[i];
        else if (localSizeSpecId[i] != unit.localSizeSpecId[i])
            error(infoSink, "Contradictory local size specialization ids");
    }

    MERGE_TRUE(earlyFragmentTests);
    MERGE_TRUE(postDepthCoverage);
    MERGE_TRUE(nonCoherentColorAttachmentReadEXT);
    MERGE_TRUE(nonCoherentDepthAttachmentReadEXT);
    MERGE_TRUE(nonCoherentStencilAttachmentReadEXT);

    if (depthLayout == EldNone)
        depthLayout = unit.depthLayout;
    else if (depthLayout != unit.depthLayout)
        error(infoSink, "Contradictory depth layouts");

    MERGE_TRUE(depthReplacing);
    MERGE_TRUE(hlslFunctionality1);

    blendEquations |= unit.blendEquations;

    MERGE_TRUE(xfbMode);

    for (size_t b = 0; b < xfbBuffers.size(); ++b) {
        if (xfbBuffers[b].stride == TQualifier::layoutXfbStrideEnd)
            xfbBuffers[b].stride = unit.xfbBuffers[b].stride;
        else if (xfbBuffers[b].stride != unit.xfbBuffers[b].stride)
            error(infoSink, "Contradictory xfb_stride");
        xfbBuffers[b].implicitStride = std::max(xfbBuffers[b].implicitStride, unit.xfbBuffers[b].implicitStride);
        if (unit.xfbBuffers[b].contains64BitType)
            xfbBuffers[b].contains64BitType = true;
        if (unit.xfbBuffers[b].contains32BitType)
            xfbBuffers[b].contains32BitType = true;
        if (unit.xfbBuffers[b].contains16BitType)
            xfbBuffers[b].contains16BitType = true;
        // TODO: 4.4 link: enhanced layouts: compare ranges
    }

    MERGE_TRUE(multiStream);
    MERGE_TRUE(layoutOverrideCoverage);
    MERGE_TRUE(geoPassthroughEXT);

    for (unsigned int i = 0; i < unit.shiftBinding.size(); ++i) {
        if (unit.shiftBinding[i] > 0)
            setShiftBinding((TResourceType)i, unit.shiftBinding[i]);
    }

    for (unsigned int i = 0; i < unit.shiftBindingForSet.size(); ++i) {
        for (auto it = unit.shiftBindingForSet[i].begin(); it != unit.shiftBindingForSet[i].end(); ++it)
            setShiftBindingForSet((TResourceType)i, it->second, it->first);
    }

    resourceSetBinding.insert(resourceSetBinding.end(), unit.resourceSetBinding.begin(), unit.resourceSetBinding.end());

    MERGE_TRUE(autoMapBindings);
    MERGE_TRUE(autoMapLocations);
    MERGE_TRUE(invertY);
    MERGE_TRUE(dxPositionW);
    MERGE_TRUE(debugInfo);
    MERGE_TRUE(flattenUniformArrays);
    MERGE_TRUE(useUnknownFormat);
    MERGE_TRUE(hlslOffsets);
    MERGE_TRUE(useStorageBuffer);
    MERGE_TRUE(invariantAll);
    MERGE_TRUE(hlslIoMapping);

    // TODO: sourceFile
    // TODO: sourceText
    // TODO: processes

    MERGE_TRUE(needToLegalize);
    MERGE_TRUE(binaryDoubleOutput);
    MERGE_TRUE(usePhysicalStorageBuffer);
}